

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O3

int Extra_ThreshComputeChow(word *t,int nVars,int *pChow)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar3 = 0;
  memset(pChow,0,(long)nVars * 4);
  if (nVars != 0x1f) {
    uVar2 = 0;
    iVar3 = 0;
    do {
      if ((t[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
        iVar3 = iVar3 + 1;
        if (0 < nVars) {
          uVar4 = 0;
          do {
            if (((uint)uVar2 >> ((uint)uVar4 & 0x1f) & 1) != 0) {
              pChow[uVar4] = pChow[uVar4] + 1;
            }
            uVar4 = uVar4 + 1;
          } while ((uint)nVars != uVar4);
        }
      }
      uVar1 = (uint)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 1 << ((byte)nVars & 0x1f));
    if (nVars < 1) goto LAB_008242f2;
  }
  uVar2 = 0;
  do {
    pChow[uVar2] = pChow[uVar2] * 2 - iVar3;
    uVar2 = uVar2 + 1;
  } while ((uint)nVars != uVar2);
LAB_008242f2:
  return (-1 << ((byte)nVars - 1 & 0x1f)) + iVar3;
}

Assistant:

int Extra_ThreshComputeChow(word * t, int nVars, int * pChow) {
    int i, k, Chow0 = 0, nMints = (1 << nVars);
    memset(pChow, 0, sizeof(int) * nVars);
    // compute Chow coefs
    for (i = 0; i < nMints; i++)
        if (Abc_TtGetBit(t, i))
            for (Chow0++, k = 0; k < nVars; k++)
                if ((i >> k) & 1)
                    pChow[k]++;
    // compute modified Chow coefs
    for (k = 0; k < nVars; k++)
        pChow[k] = 2 * pChow[k] - Chow0;
    return Chow0 - (1 << (nVars - 1));
}